

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_delphi_generator.cc
# Opt level: O0

void __thiscall
t_delphi_generator::generate_delphi_clear_union_value
          (t_delphi_generator *this,ostream *out,string *cls_prefix,string *name,t_type *type,
          t_field *tfield,string *fieldPrefix,bool is_xception_class,bool is_union,
          bool is_xception_factory,string *xception_factory_name)

{
  int iVar1;
  ostream *poVar2;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_78;
  byte local_51;
  t_type *ptStack_50;
  bool is_xception;
  t_type *ftype;
  bool is_xception_factory_local;
  bool is_union_local;
  t_field *ptStack_40;
  bool is_xception_class_local;
  t_field *tfield_local;
  t_type *type_local;
  string *name_local;
  string *cls_prefix_local;
  ostream *out_local;
  t_delphi_generator *this_local;
  
  ftype._7_1_ = is_xception_class;
  ftype._6_1_ = is_union;
  ftype._5_1_ = is_xception_factory;
  ptStack_40 = tfield;
  tfield_local = (t_field *)type;
  type_local = (t_type *)name;
  name_local = cls_prefix;
  cls_prefix_local = (string *)out;
  out_local = (ostream *)this;
  ptStack_50 = t_field::get_type(tfield);
  iVar1 = (*(ptStack_50->super_t_doc)._vptr_t_doc[0xc])();
  local_51 = (byte)iVar1;
  poVar2 = indent_impl(this,(ostream *)cls_prefix_local);
  poVar2 = std::operator<<(poVar2,"if F__isset_");
  prop_name_abi_cxx11_(&local_78,this,ptStack_40,(bool)(ftype._7_1_ & 1));
  poVar2 = std::operator<<(poVar2,(string *)&local_78);
  poVar2 = std::operator<<(poVar2," then begin");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_78);
  indent_up_impl(this);
  poVar2 = indent_impl(this,(ostream *)cls_prefix_local);
  poVar2 = std::operator<<(poVar2,"F__isset_");
  prop_name_abi_cxx11_(&local_a8,this,ptStack_40,(bool)(ftype._7_1_ & 1));
  poVar2 = std::operator<<(poVar2,(string *)&local_a8);
  poVar2 = std::operator<<(poVar2," := False;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a8);
  poVar2 = indent_impl(this,(ostream *)cls_prefix_local);
  poVar2 = std::operator<<(poVar2,(string *)fieldPrefix);
  prop_name_abi_cxx11_(&local_c8,this,ptStack_40,(bool)(ftype._7_1_ & 1));
  poVar2 = std::operator<<(poVar2,(string *)&local_c8);
  poVar2 = std::operator<<(poVar2," := ");
  poVar2 = std::operator<<(poVar2,"Default( ");
  type_name_abi_cxx11_(&local_e8,this,ptStack_50,false,true,(bool)(local_51 & 1),true);
  poVar2 = std::operator<<(poVar2,(string *)&local_e8);
  poVar2 = std::operator<<(poVar2,");");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  indent_down_impl(this);
  poVar2 = indent_impl(this,(ostream *)cls_prefix_local);
  poVar2 = std::operator<<(poVar2,"end;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_delphi_generator::generate_delphi_clear_union_value(ostream& out,
                                                           std::string cls_prefix,
                                                           std::string name,
                                                           t_type* type,
                                                           t_field* tfield,
                                                           std::string fieldPrefix,
                                                           bool is_xception_class,
                                                           bool is_union,
                                                           bool is_xception_factory,
                                                           std::string xception_factory_name) {
  (void)cls_prefix;
  (void)name;
  (void)type;
  (void)is_union;
  (void)is_xception_factory;
  (void)xception_factory_name;

  t_type* ftype = tfield->get_type();
  bool is_xception = ftype->is_xception();

  indent_impl(out) << "if F__isset_" << prop_name(tfield, is_xception_class) << " then begin"
                   << endl;
  indent_up_impl();
  indent_impl(out) << "F__isset_" << prop_name(tfield, is_xception_class) << " := False;" << endl;
  indent_impl(out) << fieldPrefix << prop_name(tfield, is_xception_class) << " := "
                   << "Default( " << type_name(ftype, false, true, is_xception, true) << ");"
                   << endl;
  indent_down_impl();
  indent_impl(out) << "end;" << endl;
}